

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testDataForCorner(tst_InsertProxyModel *this)

{
  QList<QList<QVariant>_> *this_00;
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_01;
  int iVar5;
  anon_union_24_3_e3d07ef4_for_data local_1d8;
  InsertProxyModel proxyModel;
  QModelIndex local_1a0;
  QList<int> roles;
  QArrayDataPointer<QVariant> local_170;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  QSignalSpy cornerDataChangeSpy;
  QSignalSpy cornerChangeSpy;
  
  parent = createListModel(&this->super_QObject);
  InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
  this_01 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_01,(QAbstractItemModel *)&proxyModel,(QObject *)parent);
  QSignalSpy::QSignalSpy
            (&cornerChangeSpy,(QObject *)&proxyModel,"2dataForCornerChanged(QVector<int>)");
  QSignalSpy::QSignalSpy
            (&cornerDataChangeSpy,(QObject *)&proxyModel,
             "2dataChanged(QModelIndex, QModelIndex, QVector<int>)");
  cVar1 = QTest::qVerify(cornerChangeSpy.sig.d.size != 0,"cornerChangeSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x201);
  if (cVar1 != '\0') {
    cVar1 = QTest::qVerify(cornerDataChangeSpy.sig.d.size != 0,"cornerDataChangeSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x202);
    if (cVar1 != '\0') {
      local_1d8._0_4_ = 3;
      InsertProxyModel::setInsertDirection(&proxyModel);
      InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
      QVariant::QVariant((QVariant *)&local_1d8,0x1639);
      iVar5 = (int)&local_1d8;
      InsertProxyModel::setDataForCorner((QVariant *)&proxyModel,iVar5);
      QVariant::~QVariant((QVariant *)&local_1d8);
      local_1a0.r = -1;
      local_1a0.c = -1;
      local_1a0.i = 0;
      local_1a0.m = (QAbstractItemModel *)0x0;
      uVar3 = (**(code **)(*(long *)parent + 0x78))(parent);
      local_170.d = (Data *)0xffffffffffffffff;
      local_170.ptr = (QVariant *)0x0;
      local_170.size = 0;
      (**(code **)(*(long *)parent + 0x80))(parent);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      InsertProxyModel::index((int)&roles,(int)&proxyModel,(QModelIndex *)(ulong)uVar3);
      QModelIndex::data((QVariant *)&local_1d8,(QModelIndex *)&roles,0);
      iVar4 = QVariant::toInt((bool *)local_1d8.data);
      cVar1 = QTest::qCompare(iVar4,0x1639,
                              "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                              ,"5689",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x206);
      QVariant::~QVariant((QVariant *)&local_1d8);
      if (cVar1 != '\0') {
        InsertProxyModel::dataForCorner(iVar5);
        iVar4 = QVariant::toInt((bool *)local_1d8.data);
        cVar1 = QTest::qCompare(iVar4,0x1639,"proxyModel.dataForCorner().toInt()","5689",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x207);
        QVariant::~QVariant((QVariant *)&local_1d8);
        if (cVar1 != '\0') {
          cVar1 = QTest::qCompare(cornerChangeSpy.super_QList<QList<QVariant>_>.d.size,1,
                                  "cornerChangeSpy.count()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                  ,0x208);
          if (cVar1 != '\0') {
            cVar1 = QTest::qCompare(cornerDataChangeSpy.super_QList<QList<QVariant>_>.d.size,1,
                                    "cornerDataChangeSpy.count()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                    ,0x209);
            if (cVar1 != '\0') {
              this_00 = &cornerChangeSpy.super_QList<QList<QVariant>_>;
              QList<QList<QVariant>_>::value((QList<QVariant> *)&local_1a0,this_00,0);
              QList<QVariant>::value((QVariant *)&local_1d8,(QList<QVariant> *)&local_1a0,0);
              qvariant_cast<QList<int>>(&roles,(QVariant *)&local_1d8);
              QVariant::~QVariant((QVariant *)&local_1d8);
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)&local_1a0);
              QList<QList<QVariant>_>::clear(this_00);
              QList<QList<QVariant>_>::clear(&cornerDataChangeSpy.super_QList<QList<QVariant>_>);
              cVar1 = QTest::qCompare(roles.d.size,2,"roles.size()","2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x20d);
              if (cVar1 != '\0') {
                local_1d8._0_4_ = 2;
                bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                  ((QListSpecialMethodsBase<int> *)&roles,
                                   (ItemDataRole *)local_1d8.data);
                cVar1 = QTest::qVerify(bVar2,"roles.contains(Qt::EditRole)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x20e);
                if (cVar1 != '\0') {
                  local_1d8._0_4_ = 0;
                  bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                    ((QListSpecialMethodsBase<int> *)&roles,
                                     (ItemDataRole *)local_1d8.data);
                  cVar1 = QTest::qVerify(bVar2,"roles.contains(Qt::DisplayRole)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x20f);
                  if (cVar1 != '\0') {
                    InsertProxyModel::setMergeDisplayEdit(SUB81(&proxyModel,0));
                    QVariant::QVariant((QVariant *)&local_1d8,0x2225);
                    InsertProxyModel::setDataForCorner((QVariant *)&proxyModel,iVar5);
                    QVariant::~QVariant((QVariant *)&local_1d8);
                    local_170.d = (Data *)0xffffffffffffffff;
                    local_170.ptr = (QVariant *)0x0;
                    local_170.size = 0;
                    uVar3 = (**(code **)(*(long *)parent + 0x78))(parent);
                    local_158 = 0xffffffffffffffff;
                    local_150 = 0;
                    uStack_148 = 0;
                    (**(code **)(*(long *)parent + 0x80))(parent);
                    local_140 = 0xffffffffffffffff;
                    local_138 = 0;
                    uStack_130 = 0;
                    InsertProxyModel::index
                              ((int)&local_1a0,(int)&proxyModel,(QModelIndex *)(ulong)uVar3);
                    QModelIndex::data((QVariant *)&local_1d8,&local_1a0,0);
                    iVar4 = QVariant::toInt((bool *)local_1d8.data);
                    cVar1 = QTest::qCompare(iVar4,0x1639,
                                            "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                                            ,"5689",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                            ,0x212);
                    QVariant::~QVariant((QVariant *)&local_1d8);
                    if (cVar1 != '\0') {
                      InsertProxyModel::dataForCorner(iVar5);
                      iVar4 = QVariant::toInt((bool *)local_1d8.data);
                      cVar1 = QTest::qCompare(iVar4,0x1639,"proxyModel.dataForCorner().toInt()",
                                              "5689",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                              ,0x213);
                      QVariant::~QVariant((QVariant *)&local_1d8);
                      if (cVar1 != '\0') {
                        local_170.d = (Data *)0xffffffffffffffff;
                        local_170.ptr = (QVariant *)0x0;
                        local_170.size = 0;
                        uVar3 = (**(code **)(*(long *)parent + 0x78))(parent);
                        local_158 = 0xffffffffffffffff;
                        local_150 = 0;
                        uStack_148 = 0;
                        (**(code **)(*(long *)parent + 0x80))(parent);
                        local_140 = 0xffffffffffffffff;
                        local_138 = 0;
                        uStack_130 = 0;
                        InsertProxyModel::index
                                  ((int)&local_1a0,(int)&proxyModel,(QModelIndex *)(ulong)uVar3);
                        QModelIndex::data((QVariant *)&local_1d8,&local_1a0,2);
                        iVar4 = QVariant::toInt((bool *)local_1d8.data);
                        cVar1 = QTest::qCompare(iVar4,0x2225,
                                                "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt()"
                                                ,"8741",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                ,0x214);
                        QVariant::~QVariant((QVariant *)&local_1d8);
                        if (cVar1 != '\0') {
                          InsertProxyModel::dataForCorner(iVar5);
                          iVar4 = QVariant::toInt((bool *)local_1d8.data);
                          cVar1 = QTest::qCompare(iVar4,0x2225,
                                                  "proxyModel.dataForCorner(Qt::EditRole).toInt()",
                                                  "8741",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x215);
                          QVariant::~QVariant((QVariant *)&local_1d8);
                          if (cVar1 != '\0') {
                            cVar1 = QTest::qCompare(cornerChangeSpy.super_QList<QList<QVariant>_>.d.
                                                    size,1,"cornerChangeSpy.count()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x216);
                            if (cVar1 != '\0') {
                              cVar1 = QTest::qCompare(cornerDataChangeSpy.
                                                      super_QList<QList<QVariant>_>.d.size,1,
                                                      "cornerDataChangeSpy.count()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x217);
                              if (cVar1 != '\0') {
                                QList<QList<QVariant>_>::value
                                          ((QList<QVariant> *)&local_170,this_00,0);
                                QList<QVariant>::value
                                          ((QVariant *)&local_1d8,(QList<QVariant> *)&local_170,0);
                                qvariant_cast<QList<int>>
                                          ((QList<int> *)&local_1a0,(QVariant *)&local_1d8);
                                QArrayDataPointer<int>::operator=
                                          (&roles.d,(QArrayDataPointer<int> *)&local_1a0);
                                QArrayDataPointer<int>::~QArrayDataPointer
                                          ((QArrayDataPointer<int> *)&local_1a0);
                                QVariant::~QVariant((QVariant *)&local_1d8);
                                QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_170);
                                QList<QList<QVariant>_>::clear(this_00);
                                QList<QList<QVariant>_>::clear
                                          (&cornerDataChangeSpy.super_QList<QList<QVariant>_>);
                                cVar1 = QTest::qCompare(roles.d.size,1,"roles.size()","1",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x21b);
                                if (cVar1 != '\0') {
                                  local_1d8._0_4_ = 2;
                                  bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                                    ((QListSpecialMethodsBase<int> *)&roles,
                                                     (ItemDataRole *)local_1d8.data);
                                  cVar1 = QTest::qVerify(bVar2,"roles.contains(Qt::EditRole)","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x21c);
                                  if (cVar1 != '\0') {
                                    QObject::deleteLater();
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              QArrayDataPointer<int>::~QArrayDataPointer(&roles.d);
            }
          }
        }
      }
    }
  }
  QSignalSpy::~QSignalSpy(&cornerDataChangeSpy);
  QSignalSpy::~QSignalSpy(&cornerChangeSpy);
  InsertProxyModel::~InsertProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_InsertProxyModel::testDataForCorner()
{
    QAbstractItemModel *const baseModel = createListModel(this);
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    QSignalSpy cornerChangeSpy(&proxyModel, SIGNAL(dataForCornerChanged(QVector<int>)));
    QSignalSpy cornerDataChangeSpy(&proxyModel, SIGNAL(dataChanged(QModelIndex, QModelIndex, QVector<int>)));
    QVERIFY(cornerChangeSpy.isValid());
    QVERIFY(cornerDataChangeSpy.isValid());
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setDataForCorner(5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    auto roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 2);
    QVERIFY(roles.contains(Qt::EditRole));
    QVERIFY(roles.contains(Qt::DisplayRole));
    proxyModel.setMergeDisplayEdit(false);
    proxyModel.setDataForCorner(8741);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt(), 8741);
    QCOMPARE(proxyModel.dataForCorner(Qt::EditRole).toInt(), 8741);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 1);
    QVERIFY(roles.contains(Qt::EditRole));
    baseModel->deleteLater();
}